

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  long lVar4;
  long lVar5;
  PrimRefMB *pPVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  uint uVar25;
  ulong uVar26;
  int iVar28;
  size_t itime;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar62 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar63 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  vfloat4 a0;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar110;
  float fVar111;
  vfloat4 b1;
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined4 uVar114;
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  ulong local_338;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  size_t local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  ulong local_210;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 auStack_1f8 [16];
  anon_class_16_2_07cfa4d6 local_1e8;
  float local_1d8;
  undefined4 uStack_1d4;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong uVar27;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar30 = r->_begin;
  local_258 = SUB6416(ZEXT464(0x3f800000),0);
  auVar100 = ZEXT1664(ZEXT816(0) << 0x40);
  local_338 = 0;
  auVar104 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
  auVar70._16_16_ = in_YmmResult._16_16_;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
  auVar115 = ZEXT1664(auVar41);
  auVar70._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
  auVar116 = ZEXT1664(auVar70._0_16_);
  local_288 = SUB6416(ZEXT464(0x3f800000),0);
  local_298 = ZEXT816(0);
  local_2a8._8_4_ = 0xff800000;
  local_2a8._0_8_ = 0xff800000ff800000;
  local_2a8._12_4_ = 0xff800000;
  local_2b8._8_4_ = 0x7f800000;
  local_2b8._0_8_ = 0x7f8000007f800000;
  local_2b8._12_4_ = 0x7f800000;
  local_268._8_4_ = 0xff800000;
  local_268._0_8_ = 0xff800000ff800000;
  local_268._12_4_ = 0xff800000;
  local_2c8._8_4_ = 0xff800000;
  local_2c8._0_8_ = 0xff800000ff800000;
  local_2c8._12_4_ = 0xff800000;
  local_278._8_4_ = 0x7f800000;
  local_278._0_8_ = 0x7f8000007f800000;
  local_278._12_4_ = 0x7f800000;
  local_2e8._8_4_ = 0x7f800000;
  local_2e8._0_8_ = 0x7f8000007f800000;
  local_2e8._12_4_ = 0x7f800000;
  local_2d8 = ZEXT816(0);
  local_2f0 = k;
LAB_01c2221a:
  if (r->_end <= uVar30) {
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      lower.field_0 = local_2e8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
             bounds0.lower.field_0 + 8) = local_2e8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      upper.field_0 = local_2c8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
             bounds0.upper.field_0 + 8) = local_2c8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = local_2b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
             bounds1.lower.field_0 + 8) = local_2b8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = local_2a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
             bounds1.upper.field_0 + 8) = local_2a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_278._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_278._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_268._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_268._8_8_;
    BVar1 = (BBox1f)vmovlps_avx(local_258);
    __return_storage_ptr__->time_range = BVar1;
    (__return_storage_ptr__->object_range)._end = local_2d8._0_8_;
    __return_storage_ptr__->num_time_segments = local_2d8._8_8_;
    __return_storage_ptr__->max_num_time_segments = local_338;
    (__return_storage_ptr__->max_time_range).lower = (float)local_298._0_4_;
    (__return_storage_ptr__->max_time_range).upper = (float)local_288._0_4_;
    return __return_storage_ptr__;
  }
  BVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  auVar41._8_8_ = 0;
  auVar41._0_4_ = BVar1.lower;
  auVar41._4_4_ = BVar1.upper;
  auVar41 = vmovshdup_avx(auVar41);
  fVar85 = BVar1.lower;
  fVar14 = auVar41._0_4_ - fVar85;
  uVar25 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                               super_CurveGeometry.super_Geometry.field_0x58 +
                    *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.field_0x68 * uVar30);
  uVar26 = (ulong)uVar25;
  uVar27 = (ulong)(uVar25 + 3);
  pBVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  if (uVar27 < (pBVar2->super_RawBufferView).num) {
    fVar83 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             super_Geometry.fnumTimeSegments;
    auVar41 = ZEXT416((uint)(fVar83 * ((t0t1->upper - fVar85) / fVar14) * 0.99999976));
    auVar41 = vroundss_avx(auVar41,auVar41,10);
    auVar62 = vminss_avx(auVar41,ZEXT416((uint)fVar83));
    auVar41 = ZEXT416((uint)(fVar83 * ((t0t1->lower - fVar85) / fVar14) * 1.0000002));
    auVar41 = vroundss_avx(auVar41,auVar41,9);
    auVar41 = vmaxss_avx(auVar100._0_16_,auVar41);
    uVar31 = (ulong)(uVar25 + 1);
    uVar32 = (ulong)(uVar25 + 2);
    fVar14 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             maxRadiusScale;
    uStack_1d4 = SUB84(bezier_basis0._1632_8_,4);
    uStack_1d0 = bezier_basis0._1640_8_;
    uStack_1c8 = bezier_basis0._1648_8_;
    uStack_1c0 = bezier_basis0._1656_8_;
    pBVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.normals
             .items;
    lVar33 = (long)(int)auVar41._0_4_ * 0x38 + 0x10;
    uVar29 = (long)(int)auVar41._0_4_ - 1;
LAB_01c22381:
    uVar29 = uVar29 + 1;
    bVar40 = uVar29 != (long)(int)auVar62._0_4_;
    auVar41 = auVar104._0_16_;
    if ((ulong)(long)(int)auVar62._0_4_ < uVar29) {
      local_1e8.primID = &local_210;
      fVar14 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               super_Geometry.time_range.lower;
      fVar82 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               super_Geometry.time_range.upper - fVar14;
      local_1d8 = (t0t1->lower - fVar14) / fVar82;
      fVar82 = (t0t1->upper - fVar14) / fVar82;
      fVar14 = fVar83 * local_1d8;
      fVar85 = fVar83 * fVar82;
      auVar58 = vroundss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),9);
      auVar42 = vroundss_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),10);
      auVar41 = vmaxss_avx(auVar58,ZEXT816(0));
      local_208._0_4_ = auVar41._0_4_;
      auVar62 = vminss_avx(auVar42,ZEXT416((uint)fVar83));
      iVar35 = (int)auVar41._0_4_;
      fVar98 = auVar62._0_4_;
      iVar28 = (int)auVar58._0_4_;
      iVar37 = -1;
      if (-1 < iVar28) {
        iVar37 = iVar28;
      }
      iVar17 = (int)fVar83 + 1;
      if ((int)auVar42._0_4_ < (int)fVar83 + 1) {
        iVar17 = (int)auVar42._0_4_;
      }
      local_210 = uVar30;
      local_1e8.this = this;
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_1e8,(long)iVar35);
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_1e8,(long)(int)fVar98);
      auVar41 = auVar70._16_16_;
      fVar14 = fVar14 - (float)local_208._0_4_;
      if (iVar17 - iVar37 == 1) {
        auVar62 = vmaxss_avx(ZEXT416((uint)fVar14),ZEXT816(0) << 0x40);
        fVar83 = auVar62._0_4_;
        fVar14 = 1.0 - fVar83;
        auVar50._0_4_ = fVar83 * bupper1.lower.field_0._0_4_;
        auVar50._4_4_ = fVar83 * bupper1.lower.field_0._4_4_;
        auVar50._8_4_ = fVar83 * bupper1.lower.field_0._8_4_;
        auVar50._12_4_ = fVar83 * bupper1.lower.field_0._12_4_;
        auVar45._4_4_ = fVar14;
        auVar45._0_4_ = fVar14;
        auVar45._8_4_ = fVar14;
        auVar45._12_4_ = fVar14;
        auVar62 = vfmadd231ps_fma(auVar50,auVar45,(undefined1  [16])blower0.lower.field_0);
        auVar51._0_4_ = fVar83 * bupper1.upper.field_0._0_4_;
        auVar51._4_4_ = fVar83 * bupper1.upper.field_0._4_4_;
        auVar51._8_4_ = fVar83 * bupper1.upper.field_0._8_4_;
        auVar51._12_4_ = fVar83 * bupper1.upper.field_0._12_4_;
        auVar58 = vfmadd231ps_fma(auVar51,(undefined1  [16])blower0.upper.field_0,auVar45);
        auVar42 = vmaxss_avx(ZEXT416((uint)(fVar98 - fVar85)),ZEXT816(0) << 0x40);
        fVar85 = auVar42._0_4_;
        fVar14 = 1.0 - fVar85;
        auVar48._0_4_ = fVar85 * blower0.lower.field_0._0_4_;
        auVar48._4_4_ = fVar85 * blower0.lower.field_0._4_4_;
        auVar48._8_4_ = fVar85 * blower0.lower.field_0._8_4_;
        auVar48._12_4_ = fVar85 * blower0.lower.field_0._12_4_;
        auVar47._4_4_ = fVar14;
        auVar47._0_4_ = fVar14;
        auVar47._8_4_ = fVar14;
        auVar47._12_4_ = fVar14;
        auVar42 = vfmadd231ps_fma(auVar48,auVar47,(undefined1  [16])bupper1.lower.field_0);
        auVar49._0_4_ = fVar85 * blower0.upper.field_0._0_4_;
        auVar49._4_4_ = fVar85 * blower0.upper.field_0._4_4_;
        auVar49._8_4_ = fVar85 * blower0.upper.field_0._8_4_;
        auVar49._12_4_ = fVar85 * blower0.upper.field_0._12_4_;
        auVar61 = vfmadd231ps_fma(auVar49,auVar47,(undefined1  [16])bupper1.upper.field_0);
      }
      else {
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_1e8,(long)(iVar35 + 1));
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  (&bupper0,&local_1e8,(long)((int)fVar98 + -1));
        auVar41 = vmaxss_avx(ZEXT416((uint)fVar14),ZEXT816(0) << 0x40);
        fVar84 = auVar41._0_4_;
        fVar14 = 1.0 - fVar84;
        auVar57._0_4_ = fVar84 * blower1.lower.field_0.m128[0];
        auVar57._4_4_ = fVar84 * blower1.lower.field_0.m128[1];
        auVar57._8_4_ = fVar84 * blower1.lower.field_0.m128[2];
        auVar57._12_4_ = fVar84 * blower1.lower.field_0.m128[3];
        auVar46._4_4_ = fVar14;
        auVar46._0_4_ = fVar14;
        auVar46._8_4_ = fVar14;
        auVar46._12_4_ = fVar14;
        auVar62 = vfmadd231ps_fma(auVar57,auVar46,(undefined1  [16])blower0.lower.field_0);
        auVar56._0_4_ = fVar84 * blower1.upper.field_0.m128[0];
        auVar56._4_4_ = fVar84 * blower1.upper.field_0.m128[1];
        auVar56._8_4_ = fVar84 * blower1.upper.field_0.m128[2];
        auVar56._12_4_ = fVar84 * blower1.upper.field_0.m128[3];
        auVar58 = vfmadd231ps_fma(auVar56,auVar46,(undefined1  [16])blower0.upper.field_0);
        auVar41 = vmaxss_avx(ZEXT416((uint)(fVar98 - fVar85)),ZEXT816(0) << 0x40);
        fVar85 = auVar41._0_4_;
        fVar14 = 1.0 - fVar85;
        auVar60._0_4_ = fVar85 * bupper0.lower.field_0.m128[0];
        auVar60._4_4_ = fVar85 * bupper0.lower.field_0.m128[1];
        auVar60._8_4_ = fVar85 * bupper0.lower.field_0.m128[2];
        auVar60._12_4_ = fVar85 * bupper0.lower.field_0.m128[3];
        auVar54._4_4_ = fVar14;
        auVar54._0_4_ = fVar14;
        auVar54._8_4_ = fVar14;
        auVar54._12_4_ = fVar14;
        auVar42 = vfmadd231ps_fma(auVar60,auVar54,(undefined1  [16])bupper1.lower.field_0);
        auVar59._0_4_ = fVar85 * bupper0.upper.field_0.m128[0];
        auVar59._4_4_ = fVar85 * bupper0.upper.field_0.m128[1];
        auVar59._8_4_ = fVar85 * bupper0.upper.field_0.m128[2];
        auVar59._12_4_ = fVar85 * bupper0.upper.field_0.m128[3];
        auVar61 = vfmadd231ps_fma(auVar59,auVar54,(undefined1  [16])bupper1.upper.field_0);
        fVar82 = fVar82 - local_1d8;
        if (iVar28 < 0) {
          iVar28 = -1;
        }
        itime = (size_t)iVar28;
        while( true ) {
          itime = itime + 1;
          auVar41 = auVar70._16_16_;
          if ((long)iVar17 <= (long)itime) break;
          fVar85 = ((float)(int)itime / fVar83 - local_1d8) / fVar82;
          fVar14 = 1.0 - fVar85;
          auVar44._0_4_ = auVar42._0_4_ * fVar85;
          fVar98 = auVar42._4_4_;
          auVar44._4_4_ = fVar98 * fVar85;
          fVar84 = auVar42._8_4_;
          auVar44._8_4_ = fVar84 * fVar85;
          fVar102 = auVar42._12_4_;
          auVar44._12_4_ = fVar102 * fVar85;
          auVar43._4_4_ = fVar14;
          auVar43._0_4_ = fVar14;
          auVar43._8_4_ = fVar14;
          auVar43._12_4_ = fVar14;
          auVar41 = vfmadd231ps_fma(auVar44,auVar43,auVar62);
          auVar55._0_4_ = auVar61._0_4_ * fVar85;
          auVar55._4_4_ = auVar61._4_4_ * fVar85;
          auVar55._8_4_ = auVar61._8_4_ * fVar85;
          auVar55._12_4_ = auVar61._12_4_ * fVar85;
          auVar46 = vfmadd231ps_fma(auVar55,auVar58,auVar43);
          _local_208 = auVar61;
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_1e8,itime);
          local_328 = auVar58._0_4_;
          fStack_324 = auVar58._4_4_;
          fStack_320 = auVar58._8_4_;
          fStack_31c = auVar58._12_4_;
          local_318 = auVar62._0_4_;
          fStack_314 = auVar62._4_4_;
          fStack_310 = auVar62._8_4_;
          fStack_30c = auVar62._12_4_;
          auVar41 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar41);
          auVar62 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar46);
          auVar58 = vminps_avx(auVar41,ZEXT816(0) << 0x40);
          auVar41 = vmaxps_avx(auVar62,ZEXT816(0) << 0x40);
          auVar62._0_4_ = local_318 + auVar58._0_4_;
          auVar62._4_4_ = fStack_314 + auVar58._4_4_;
          auVar62._8_4_ = fStack_310 + auVar58._8_4_;
          auVar62._12_4_ = fStack_30c + auVar58._12_4_;
          auVar42._0_4_ = auVar42._0_4_ + auVar58._0_4_;
          auVar42._4_4_ = fVar98 + auVar58._4_4_;
          auVar42._8_4_ = fVar84 + auVar58._8_4_;
          auVar42._12_4_ = fVar102 + auVar58._12_4_;
          auVar58._0_4_ = local_328 + auVar41._0_4_;
          auVar58._4_4_ = fStack_324 + auVar41._4_4_;
          auVar58._8_4_ = fStack_320 + auVar41._8_4_;
          auVar58._12_4_ = fStack_31c + auVar41._12_4_;
          auVar61._0_4_ = (float)local_208._0_4_ + auVar41._0_4_;
          auVar61._4_4_ = (float)local_208._4_4_ + auVar41._4_4_;
          auVar61._8_4_ = fStack_200 + auVar41._8_4_;
          auVar61._12_4_ = fStack_1fc + auVar41._12_4_;
        }
      }
      aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar62,ZEXT416(geomID),0x30);
      uVar25 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               super_Geometry.numTimeSteps - 1;
      uVar27 = (ulong)uVar25;
      BVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar52._8_8_ = 0;
      auVar52._0_4_ = BVar1.lower;
      auVar52._4_4_ = BVar1.upper;
      aVar11 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
               vinsertps_avx(auVar58,ZEXT416((uint)uVar30),0x30);
      aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
               vinsertps_avx(auVar42,ZEXT416(uVar25),0x30);
      aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
               vinsertps_avx(auVar61,ZEXT416(uVar25),0x30);
      auVar107._8_4_ = 0x3f000000;
      auVar107._0_8_ = 0x3f0000003f000000;
      auVar107._12_4_ = 0x3f000000;
      auVar53._0_4_ = aVar12.x * 0.5;
      auVar53._4_4_ = aVar12.y * 0.5;
      auVar53._8_4_ = aVar12.z * 0.5;
      auVar53._12_4_ = aVar12.field_3.w * 0.5;
      auVar62 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar10,auVar107);
      auVar105._0_4_ = aVar13.x * 0.5;
      auVar105._4_4_ = aVar13.y * 0.5;
      auVar105._8_4_ = aVar13.z * 0.5;
      auVar105._12_4_ = aVar13.field_3.w * 0.5;
      auVar58 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar11,auVar107);
      auVar99._0_4_ = auVar62._0_4_ + auVar58._0_4_;
      auVar99._4_4_ = auVar62._4_4_ + auVar58._4_4_;
      auVar99._8_4_ = auVar62._8_4_ + auVar58._8_4_;
      auVar99._12_4_ = auVar62._12_4_ + auVar58._12_4_;
      local_2e8 = vminps_avx(local_2e8,(undefined1  [16])aVar10);
      local_2c8 = vmaxps_avx(local_2c8,(undefined1  [16])aVar11);
      local_2b8 = vminps_avx(local_2b8,(undefined1  [16])aVar12);
      local_2a8 = vmaxps_avx(local_2a8,(undefined1  [16])aVar13);
      local_278 = vminps_avx(local_278,auVar99);
      local_268 = vmaxps_avx(local_268,auVar99);
      uVar26 = vcmpps_avx512vl(local_258,auVar52,1);
      auVar58 = vinsertps_avx(local_258,auVar52,0x50);
      auVar62 = vblendps_avx(auVar52,local_258,2);
      bVar40 = (bool)((byte)uVar26 & 1);
      bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar26 >> 3) & 1);
      local_258._4_4_ = (uint)bVar7 * auVar58._4_4_ | (uint)!bVar7 * auVar62._4_4_;
      local_258._0_4_ = (uint)bVar40 * auVar58._0_4_ | (uint)!bVar40 * auVar62._0_4_;
      local_258._8_4_ = (uint)bVar8 * auVar58._8_4_ | (uint)!bVar8 * auVar62._8_4_;
      local_258._12_4_ = (uint)bVar9 * auVar58._12_4_ | (uint)!bVar9 * auVar62._12_4_;
      auVar62 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar62 = vpinsrq_avx(auVar62,uVar27,1);
      local_2d8 = vpaddq_avx(local_2d8,auVar62);
      bVar40 = local_338 < uVar27;
      auVar62 = vmovshdup_avx(auVar52);
      auVar64._16_16_ = auVar41;
      auVar64._0_16_ = local_288;
      auVar63._4_28_ = auVar64._4_28_;
      auVar63._0_4_ = (uint)bVar40 * auVar62._0_4_ + (uint)!bVar40 * local_288._0_4_;
      local_288 = auVar63._0_16_;
      auVar67._16_16_ = auVar41;
      auVar67._0_16_ = local_298;
      auVar66._4_28_ = auVar67._4_28_;
      auVar66._0_4_ = (uint)bVar40 * (int)BVar1.lower + (uint)!bVar40 * local_298._0_4_;
      local_298 = auVar66._0_16_;
      if (local_338 <= uVar27) {
        local_338 = uVar27;
      }
      pPVar6 = prims->items;
      pPVar6[local_2f0].lbounds.bounds0.lower.field_0 = aVar10;
      pPVar6[local_2f0].lbounds.bounds0.upper.field_0 = aVar11;
      pPVar6[local_2f0].lbounds.bounds1.lower.field_0.field_1 = aVar12;
      pPVar6[local_2f0].lbounds.bounds1.upper.field_0.field_1 = aVar13;
      pPVar6[local_2f0].time_range = BVar1;
      auVar100 = ZEXT864(0) << 0x40;
      auVar104 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
      auVar115 = ZEXT1664(auVar62);
      auVar70._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
      auVar70._16_16_ = auVar41;
      auVar116 = ZEXT1664(auVar70._0_16_);
      local_2f0 = local_2f0 + 1;
      goto LAB_01c22e4f;
    }
    lVar4 = *(long *)((long)pBVar2 + lVar33 + -0x10);
    lVar5 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar33);
    lVar39 = lVar5 * uVar26;
    auVar58 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar39)),auVar41);
    vucomiss_avx512f(auVar58);
    if (SEXT816(lVar39) == SEXT816(lVar5) * SEXT816((long)uVar26) && bVar40) {
      lVar36 = lVar5 * uVar31;
      auVar58 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar36)),auVar41);
      vucomiss_avx512f(auVar58);
      if (SEXT816(lVar36) == SEXT816(lVar5) * SEXT816((long)uVar31) && bVar40) {
        lVar34 = lVar5 * uVar32;
        auVar58 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar34)),auVar41);
        vucomiss_avx512f(auVar58);
        if (SEXT816(lVar34) == SEXT816(lVar5) * SEXT816((long)uVar32) && bVar40) {
          lVar38 = lVar5 * uVar27;
          auVar41 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar38)),auVar41);
          vucomiss_avx512f(auVar41);
          if (SEXT816(lVar38) == SEXT816(lVar5) * SEXT816((long)uVar27) && bVar40) {
            auVar41 = *(undefined1 (*) [16])(lVar4 + lVar39);
            auVar58 = auVar115._0_16_;
            uVar15 = vcmpps_avx512vl(auVar41,auVar58,6);
            auVar42 = auVar116._0_16_;
            uVar16 = vcmpps_avx512vl(auVar41,auVar42,1);
            if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
              auVar61 = *(undefined1 (*) [16])(lVar4 + lVar36);
              uVar15 = vcmpps_avx512vl(auVar61,auVar58,6);
              uVar16 = vcmpps_avx512vl(auVar61,auVar42,1);
              if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
                auVar46 = *(undefined1 (*) [16])(lVar4 + lVar34);
                uVar15 = vcmpps_avx512vl(auVar46,auVar58,6);
                uVar16 = vcmpps_avx512vl(auVar46,auVar42,1);
                if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
                  auVar54 = *(undefined1 (*) [16])(lVar4 + lVar38);
                  auVar70._0_16_ = auVar54;
                  uVar15 = vcmpps_avx512vl(auVar54,auVar58,6);
                  uVar16 = vcmpps_avx512vl(auVar54,auVar42,1);
                  if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
                    lVar4 = *(long *)((long)pBVar3 + lVar33 + -0x10);
                    lVar5 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar33);
                    auVar60 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar26);
                    uVar15 = vcmpps_avx512vl(auVar60,auVar58,6);
                    uVar16 = vcmpps_avx512vl(auVar60,auVar42,1);
                    if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) {
                      auVar59 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar31);
                      uVar15 = vcmpps_avx512vl(auVar59,auVar58,6);
                      uVar16 = vcmpps_avx512vl(auVar59,auVar42,1);
                      if ((~((ushort)uVar15 & (ushort)uVar16) & 7) == 0) goto code_r0x01c22506;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_01c22e2f;
  }
  goto LAB_01c22e4f;
code_r0x01c22506:
  auVar58 = vshufps_avx(auVar41,auVar41,0xff);
  auVar57 = vinsertps_avx512f(auVar41,ZEXT416((uint)(auVar58._0_4_ * fVar14)),0x30);
  auVar41 = vshufps_avx(auVar61,auVar61,0xff);
  auVar56 = vinsertps_avx512f(auVar61,ZEXT416((uint)(auVar41._0_4_ * fVar14)),0x30);
  auVar41 = vshufps_avx(auVar46,auVar46,0xff);
  auVar55 = vinsertps_avx512f(auVar46,ZEXT416((uint)(auVar41._0_4_ * fVar14)),0x30);
  auVar41 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar54 = vinsertps_avx512f(auVar54,ZEXT416((uint)(auVar41._0_4_ * fVar14)),0x30);
  auVar99 = ZEXT816(0) << 0x40;
  auVar42 = vmulps_avx512vl(auVar54,auVar99);
  auVar103._8_4_ = 0x3e2aaaab;
  auVar103._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar103._12_4_ = 0x3e2aaaab;
  auVar41 = vfmadd213ps_avx512vl(auVar103,auVar55,auVar42);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar56,auVar43);
  auVar44 = vfmadd231ps_avx512vl(auVar41,auVar57,auVar103);
  auVar61 = vshufps_avx(auVar44,auVar44,0xff);
  auVar41 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar32);
  auVar58 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar27);
  auVar45 = vmulps_avx512vl(auVar58,auVar99);
  auVar46 = vfmadd213ps_avx512vl(auVar103,auVar41,auVar45);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar59,auVar43);
  auVar46 = vfmadd231ps_fma(auVar46,auVar60,auVar103);
  auVar101._8_4_ = 0x3f000000;
  auVar101._0_8_ = 0x3f0000003f000000;
  auVar101._12_4_ = 0x3f000000;
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar55,auVar101);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar56,auVar99);
  auVar47 = vfnmadd231ps_avx512vl(auVar42,auVar57,auVar101);
  auVar48 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  auVar42 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar94._0_4_ = auVar47._0_4_ * auVar42._0_4_;
  auVar94._4_4_ = auVar47._4_4_ * auVar42._4_4_;
  auVar94._8_4_ = auVar47._8_4_ * auVar42._8_4_;
  auVar94._12_4_ = auVar47._12_4_ * auVar42._12_4_;
  auVar42 = vfmsub231ps_avx512vl(auVar94,auVar48,auVar46);
  auVar46 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar46,auVar46,0x7f);
  auVar79._16_16_ = auVar70._16_16_;
  auVar79._0_16_ = auVar99;
  auVar78._4_28_ = auVar79._4_28_;
  auVar78._0_4_ = auVar42._0_4_;
  auVar49 = vrsqrt14ss_avx512f(auVar99,auVar78._0_16_);
  auVar50 = vmulss_avx512f(auVar49,SUB6416(ZEXT464(0x3fc00000),0));
  auVar51 = vmulss_avx512f(auVar42,SUB6416(ZEXT464(0xbf000000),0));
  auVar51 = vmulss_avx512f(auVar51,auVar49);
  auVar49 = vmulss_avx512f(auVar51,ZEXT416((uint)(auVar49._0_4_ * auVar49._0_4_)));
  auVar49 = vaddss_avx512f(auVar50,auVar49);
  auVar49 = vbroadcastss_avx512vl(auVar49);
  auVar50 = vmulps_avx512vl(auVar46,auVar49);
  auVar51 = vmulps_avx512vl(auVar61,auVar50);
  auVar52 = vaddps_avx512vl(auVar44,auVar51);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar41,auVar101);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar59,auVar99);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar60,auVar101);
  auVar53 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar53 = vmulps_avx512vl(auVar47,auVar53);
  auVar45 = vfmsub231ps_avx512vl(auVar53,auVar48,auVar45);
  auVar109._8_4_ = 2;
  auVar109._0_8_ = 0x200000002;
  auVar109._12_4_ = 2;
  auVar109._16_4_ = 2;
  auVar109._20_4_ = 2;
  auVar109._24_4_ = 2;
  auVar109._28_4_ = 2;
  auVar63 = vpermps_avx512vl(auVar109,ZEXT1632(auVar52));
  auVar48 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar48 = vmulps_avx512vl(auVar48,auVar50);
  auVar50 = vrcp14ss_avx512f(auVar99,auVar78._0_16_);
  auVar53 = vbroadcastss_avx512vl(auVar42);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar50,ZEXT416(0x40000000));
  auVar42 = vmulss_avx512f(auVar50,auVar42);
  fVar85 = auVar42._0_4_;
  auVar42 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar45 = vmulps_avx512vl(auVar53,auVar42);
  auVar42 = vdpps_avx(auVar46,auVar42,0x7f);
  fVar82 = auVar42._0_4_;
  auVar95._0_4_ = fVar82 * auVar46._0_4_;
  auVar95._4_4_ = fVar82 * auVar46._4_4_;
  auVar95._8_4_ = fVar82 * auVar46._8_4_;
  auVar95._12_4_ = fVar82 * auVar46._12_4_;
  auVar42 = vsubps_avx512vl(auVar45,auVar95);
  auVar86._0_4_ = fVar85 * auVar42._0_4_;
  auVar86._4_4_ = fVar85 * auVar42._4_4_;
  auVar86._8_4_ = fVar85 * auVar42._8_4_;
  auVar86._12_4_ = fVar85 * auVar42._12_4_;
  auVar42 = vmulps_avx512vl(auVar49,auVar86);
  auVar87._0_4_ = auVar61._0_4_ * auVar42._0_4_;
  auVar87._4_4_ = auVar61._4_4_ * auVar42._4_4_;
  auVar87._8_4_ = auVar61._8_4_ * auVar42._8_4_;
  auVar87._12_4_ = auVar61._12_4_ * auVar42._12_4_;
  auVar46 = vaddps_avx512vl(auVar48,auVar87);
  auVar88._0_4_ = (auVar47._0_4_ + auVar46._0_4_) * 0.33333334;
  auVar88._4_4_ = (auVar47._4_4_ + auVar46._4_4_) * 0.33333334;
  auVar88._8_4_ = (auVar47._8_4_ + auVar46._8_4_) * 0.33333334;
  auVar88._12_4_ = (auVar47._12_4_ + auVar46._12_4_) * 0.33333334;
  auVar45 = vaddps_avx512vl(auVar52,auVar88);
  auVar64 = vpermps_avx512vl(auVar109,ZEXT1632(auVar45));
  auVar80._16_16_ = auVar64._16_16_;
  auVar42 = vmulps_avx512vl(auVar54,auVar103);
  auVar48 = vfmadd231ps_avx512vl(auVar42,auVar55,auVar43);
  auVar42 = vmulps_avx512vl(auVar58,auVar103);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar41,auVar43);
  auVar42 = vfmadd231ps_fma(auVar42,auVar59,auVar103);
  auVar61 = vfmadd231ps_fma(auVar42,auVar60,auVar99);
  auVar42 = vmulps_avx512vl(auVar54,auVar101);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar99,auVar55);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar101,auVar56);
  auVar54 = vfnmadd231ps_avx512vl(auVar42,auVar99,auVar57);
  auVar55 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar42 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar42 = vmulps_avx512vl(auVar54,auVar42);
  auVar42 = vfmsub231ps_fma(auVar42,auVar55,auVar61);
  auVar61 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar61,auVar61,0x7f);
  auVar56 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar103);
  auVar57 = vfmadd231ps_avx512vl(auVar56,auVar57,auVar99);
  fVar85 = auVar42._0_4_;
  auVar80._0_16_ = auVar99;
  auVar65._4_28_ = auVar80._4_28_;
  auVar65._0_4_ = fVar85;
  auVar56 = vrsqrt14ss_avx512f(auVar99,auVar65._0_16_);
  auVar43 = vmulss_avx512f(auVar42,SUB6416(ZEXT464(0xbf000000),0));
  auVar43 = vmulss_avx512f(auVar43,auVar56);
  auVar48 = vmulss_avx512f(auVar56,auVar56);
  auVar43 = vmulss_avx512f(auVar43,auVar48);
  auVar48 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar56 = vmulss_avx512f(auVar56,SUB6416(ZEXT464(0x3fc00000),0));
  auVar56 = vaddss_avx512f(auVar56,auVar43);
  auVar56 = vbroadcastss_avx512vl(auVar56);
  auVar43 = vmulps_avx512vl(auVar61,auVar56);
  auVar58 = vmulps_avx512vl(auVar58,auVar101);
  auVar41 = vfmadd231ps_avx512vl(auVar58,auVar99,auVar41);
  auVar58 = vmulps_avx512vl(auVar48,auVar43);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar101,auVar59);
  auVar59 = vaddps_avx512vl(auVar57,auVar58);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar99,auVar60);
  auVar60 = vshufps_avx512vl(auVar41,auVar41,0xc9);
  auVar60 = vmulps_avx512vl(auVar54,auVar60);
  auVar41 = vfmsub231ps_avx512vl(auVar60,auVar55,auVar41);
  auVar60 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar41 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar113._0_4_ = fVar85 * auVar41._0_4_;
  auVar113._4_4_ = fVar85 * auVar41._4_4_;
  auVar113._8_4_ = fVar85 * auVar41._8_4_;
  auVar113._12_4_ = fVar85 * auVar41._12_4_;
  auVar41 = vdpps_avx(auVar61,auVar41,0x7f);
  auVar60 = vmulps_avx512vl(auVar60,auVar43);
  fVar85 = auVar41._0_4_;
  auVar89._0_4_ = fVar85 * auVar61._0_4_;
  auVar89._4_4_ = fVar85 * auVar61._4_4_;
  auVar89._8_4_ = fVar85 * auVar61._8_4_;
  auVar89._12_4_ = fVar85 * auVar61._12_4_;
  auVar41 = vsubps_avx(auVar113,auVar89);
  auVar61 = vrcp14ss_avx512f(auVar99,auVar65._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar61,ZEXT416(0x40000000));
  fVar85 = auVar61._0_4_ * auVar42._0_4_;
  auVar90._0_4_ = auVar41._0_4_ * fVar85;
  auVar90._4_4_ = auVar41._4_4_ * fVar85;
  auVar90._8_4_ = auVar41._8_4_ * fVar85;
  auVar90._12_4_ = auVar41._12_4_ * fVar85;
  auVar41 = vmulps_avx512vl(auVar56,auVar90);
  auVar41 = vmulps_avx512vl(auVar48,auVar41);
  auVar61 = vaddps_avx512vl(auVar60,auVar41);
  auVar41 = vaddps_avx512vl(auVar54,auVar61);
  auVar91._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar91._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar91._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar91._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar42 = vsubps_avx512vl(auVar59,auVar91);
  auVar70 = vpermps_avx2(auVar109,ZEXT1632(auVar42));
  auVar66 = vpermps_avx512vl(auVar109,ZEXT1632(auVar59));
  auVar24._8_8_ = bezier_basis0._3952_8_;
  auVar24._0_8_ = bezier_basis0._3944_8_;
  auVar24._16_8_ = bezier_basis0._3960_8_;
  auVar24._24_8_ = bezier_basis0._3968_8_;
  auVar67 = vmulps_avx512vl(auVar66,auVar24);
  auVar19._8_8_ = bezier_basis0._2796_8_;
  auVar19._0_8_ = bezier_basis0._2788_8_;
  auVar19._16_8_ = bezier_basis0._2804_8_;
  auVar19._24_8_ = bezier_basis0._2812_8_;
  auVar67 = vfmadd231ps_avx512vl(auVar67,auVar19,auVar70);
  auVar81._8_8_ = bezier_basis0._1640_8_;
  auVar81._0_8_ = bezier_basis0._1632_8_;
  auVar81._16_8_ = bezier_basis0._1648_8_;
  auVar81._24_8_ = bezier_basis0._1656_8_;
  auVar67 = vfmadd231ps_avx512vl(auVar67,auVar81,auVar64);
  auVar20._8_8_ = bezier_basis0._484_8_;
  auVar20._0_8_ = bezier_basis0._476_8_;
  auVar20._16_8_ = bezier_basis0._492_8_;
  auVar20._24_8_ = bezier_basis0._500_8_;
  auVar67 = vfmadd231ps_avx512vl(auVar67,auVar20,auVar63);
  auVar106._8_4_ = 0xff800000;
  auVar106._0_8_ = 0xff800000ff800000;
  auVar106._12_4_ = 0xff800000;
  auVar106._16_4_ = 0xff800000;
  auVar106._20_4_ = 0xff800000;
  auVar106._24_4_ = 0xff800000;
  auVar106._28_4_ = 0xff800000;
  auVar68 = vmaxps_avx512vl(auVar106,auVar67);
  auVar77._8_8_ = bezier_basis0._8576_8_;
  auVar77._0_8_ = bezier_basis0._8568_8_;
  auVar77._16_8_ = bezier_basis0._8584_8_;
  auVar77._24_8_ = bezier_basis0._8592_8_;
  fVar85 = (float)bezier_basis0._8568_8_;
  fVar82 = SUB84(bezier_basis0._8568_8_,4);
  auVar69._4_4_ = fVar82 * auVar66._4_4_;
  auVar69._0_4_ = fVar85 * auVar66._0_4_;
  fVar98 = (float)bezier_basis0._8576_8_;
  auVar69._8_4_ = fVar98 * auVar66._8_4_;
  fVar84 = SUB84(bezier_basis0._8576_8_,4);
  auVar69._12_4_ = fVar84 * auVar66._12_4_;
  fVar102 = (float)bezier_basis0._8584_8_;
  auVar69._16_4_ = fVar102 * auVar66._16_4_;
  fVar110 = SUB84(bezier_basis0._8584_8_,4);
  auVar69._20_4_ = fVar110 * auVar66._20_4_;
  fVar111 = (float)bezier_basis0._8592_8_;
  auVar69._24_4_ = fVar111 * auVar66._24_4_;
  auVar69._28_4_ = auVar66._28_4_;
  auVar21._8_8_ = bezier_basis0._7420_8_;
  auVar21._0_8_ = bezier_basis0._7412_8_;
  auVar21._16_8_ = bezier_basis0._7428_8_;
  auVar21._24_8_ = bezier_basis0._7436_8_;
  auVar41 = vfmadd231ps_fma(auVar69,auVar21,auVar70);
  auVar22._8_8_ = bezier_basis0._6264_8_;
  auVar22._0_8_ = bezier_basis0._6256_8_;
  auVar22._16_8_ = bezier_basis0._6272_8_;
  auVar22._24_8_ = bezier_basis0._6280_8_;
  auVar64 = vfmadd231ps_avx512vl(ZEXT1632(auVar41),auVar22,auVar64);
  auVar23._8_8_ = bezier_basis0._5108_8_;
  auVar23._0_8_ = bezier_basis0._5100_8_;
  auVar23._16_8_ = bezier_basis0._5116_8_;
  auVar23._24_8_ = bezier_basis0._5124_8_;
  auVar63 = vfmadd231ps_avx512vl(auVar64,auVar23,auVar63);
  auVar108._8_4_ = 0x3d638e39;
  auVar108._0_8_ = 0x3d638e393d638e39;
  auVar108._12_4_ = 0x3d638e39;
  auVar108._16_4_ = 0x3d638e39;
  auVar108._20_4_ = 0x3d638e39;
  auVar108._24_4_ = 0x3d638e39;
  auVar108._28_4_ = 0x3d638e39;
  auVar71._4_4_ = auVar63._4_4_ * 0.055555556;
  auVar71._0_4_ = auVar63._0_4_ * 0.055555556;
  auVar71._8_4_ = auVar63._8_4_ * 0.055555556;
  auVar71._12_4_ = auVar63._12_4_ * 0.055555556;
  auVar71._16_4_ = auVar63._16_4_ * 0.055555556;
  auVar71._20_4_ = auVar63._20_4_ * 0.055555556;
  auVar71._24_4_ = auVar63._24_4_ * 0.055555556;
  auVar71._28_4_ = auVar70._28_4_;
  auVar18 = ZEXT812(0);
  auVar70 = vblendps_avx(auVar71,ZEXT1232(auVar18) << 0x20,1);
  auVar64 = vsubps_avx512vl(auVar67,auVar70);
  auVar70 = vblendps_avx(auVar71,ZEXT1232(auVar18) << 0x20,0x80);
  auVar66 = vaddps_avx512vl(auVar67,auVar70);
  auVar70 = vmaxps_avx(auVar64,auVar66);
  auVar63 = vmaxps_avx(auVar68,auVar70);
  auVar69 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar70 = vpermps_avx512vl(auVar69,ZEXT1632(auVar52));
  auVar71 = vpermps_avx512vl(auVar69,ZEXT1632(auVar45));
  auVar68 = vpermps_avx512vl(auVar69,ZEXT1632(auVar42));
  auVar72 = vpermps_avx512vl(auVar69,ZEXT1632(auVar59));
  auVar73 = vmulps_avx512vl(auVar72,auVar24);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar19,auVar68);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar81,auVar71);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar20,auVar70);
  auVar72 = vmulps_avx512vl(auVar72,auVar77);
  auVar68 = vfmadd231ps_avx512vl(auVar72,auVar21,auVar68);
  auVar72 = vmaxps_avx512vl(auVar106,auVar73);
  auVar71 = vfmadd231ps_avx512vl(auVar68,auVar22,auVar71);
  auVar70 = vfmadd231ps_avx512vl(auVar71,auVar23,auVar70);
  auVar71 = vmulps_avx512vl(auVar70,auVar108);
  auVar78 = ZEXT1232(auVar18) << 0x20;
  auVar70 = vblendps_avx(auVar71,auVar78,1);
  auVar68 = vsubps_avx512vl(auVar73,auVar70);
  auVar70 = vblendps_avx(auVar71,auVar78,0x80);
  auVar71 = vaddps_avx512vl(auVar73,auVar70);
  auVar70 = vmaxps_avx512vl(auVar68,auVar71);
  _local_208 = vmaxps_avx512vl(auVar72,auVar70);
  auVar70 = vbroadcastss_avx512vl(auVar52);
  auVar72 = vbroadcastss_avx512vl(auVar45);
  auVar92._0_4_ = auVar42._0_4_;
  auVar92._4_4_ = auVar92._0_4_;
  auVar92._8_4_ = auVar92._0_4_;
  auVar92._12_4_ = auVar92._0_4_;
  auVar92._16_4_ = auVar92._0_4_;
  auVar92._20_4_ = auVar92._0_4_;
  auVar92._24_4_ = auVar92._0_4_;
  auVar92._28_4_ = auVar92._0_4_;
  auVar74 = vbroadcastss_avx512vl(auVar59);
  auVar75 = vmulps_avx512vl(auVar74,auVar24);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar19,auVar92);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar81,auVar72);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar20,auVar70);
  auVar74 = vmulps_avx512vl(auVar74,auVar77);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar21,auVar92);
  auVar76 = vmaxps_avx512vl(auVar106,auVar75);
  auVar72 = vfmadd231ps_avx512vl(auVar74,auVar22,auVar72);
  auVar70 = vfmadd231ps_avx512vl(auVar72,auVar23,auVar70);
  auVar72 = vmulps_avx512vl(auVar70,auVar108);
  auVar70 = vblendps_avx(auVar72,auVar78,1);
  auVar74 = vsubps_avx512vl(auVar75,auVar70);
  auVar70 = vblendps_avx(auVar72,auVar78,0x80);
  auVar72 = vaddps_avx512vl(auVar75,auVar70);
  auVar70 = vmaxps_avx512vl(auVar74,auVar72);
  auVar77 = vmaxps_avx512vl(auVar76,auVar70);
  auVar70 = vminps_avx(auVar64,auVar66);
  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar64 = vminps_avx512vl(auVar66,auVar67);
  auVar67 = vminps_avx512vl(auVar64,auVar70);
  auVar70 = vminps_avx512vl(auVar66,auVar73);
  auVar64 = vminps_avx512vl(auVar68,auVar71);
  auVar71 = vminps_avx512vl(auVar70,auVar64);
  auVar64 = vminps_avx512vl(auVar66,auVar75);
  auVar70 = vminps_avx(auVar74,auVar72);
  auVar78 = vminps_avx512vl(auVar64,auVar70);
  auVar42 = vsubps_avx(auVar44,auVar51);
  uVar114 = auVar42._0_4_;
  auVar93._4_4_ = uVar114;
  auVar93._0_4_ = uVar114;
  auVar93._8_4_ = uVar114;
  auVar93._12_4_ = uVar114;
  auVar93._16_4_ = uVar114;
  auVar93._20_4_ = uVar114;
  auVar93._24_4_ = uVar114;
  auVar93._28_4_ = uVar114;
  auVar41 = vsubps_avx(auVar47,auVar46);
  auVar96._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar96._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar96._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar96._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar46 = vaddps_avx512vl(auVar42,auVar96);
  auVar70 = vbroadcastss_avx512vl(auVar46);
  auVar60 = vsubps_avx512vl(auVar57,auVar58);
  auVar41 = vsubps_avx512vl(auVar54,auVar61);
  auVar97._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar97._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar97._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar97._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar61 = vsubps_avx512vl(auVar60,auVar97);
  auVar72 = vbroadcastss_avx512vl(auVar61);
  auVar73 = vbroadcastss_avx512vl(auVar60);
  auVar112._0_4_ = (float)bezier_basis0._3944_8_ * auVar73._0_4_;
  auVar112._4_4_ = SUB84(bezier_basis0._3944_8_,4) * auVar73._4_4_;
  auVar112._8_4_ = (float)bezier_basis0._3952_8_ * auVar73._8_4_;
  auVar112._12_4_ = SUB84(bezier_basis0._3952_8_,4) * auVar73._12_4_;
  auVar112._16_4_ = (float)bezier_basis0._3960_8_ * auVar73._16_4_;
  auVar112._20_4_ = SUB84(bezier_basis0._3960_8_,4) * auVar73._20_4_;
  auVar112._24_4_ = (float)bezier_basis0._3968_8_ * auVar73._24_4_;
  auVar112._28_4_ = 0;
  auVar41 = vfmadd231ps_fma(auVar112,auVar19,auVar72);
  auVar64 = vfmadd231ps_avx512vl(ZEXT1632(auVar41),auVar81,auVar70);
  auVar79 = vfmadd231ps_avx512vl(auVar64,auVar20,auVar93);
  auVar64 = vmaxps_avx(auVar106,auVar79);
  auVar68._4_4_ = fVar82 * auVar73._4_4_;
  auVar68._0_4_ = fVar85 * auVar73._0_4_;
  auVar68._8_4_ = fVar98 * auVar73._8_4_;
  auVar68._12_4_ = fVar84 * auVar73._12_4_;
  auVar68._16_4_ = fVar102 * auVar73._16_4_;
  auVar68._20_4_ = fVar110 * auVar73._20_4_;
  auVar68._24_4_ = fVar111 * auVar73._24_4_;
  auVar68._28_4_ = auVar73._28_4_;
  auVar41 = vfmadd231ps_fma(auVar68,auVar21,auVar72);
  auVar70 = vfmadd231ps_avx512vl(ZEXT1632(auVar41),auVar22,auVar70);
  auVar41 = vfmadd231ps_fma(auVar70,auVar23,auVar93);
  auVar72._28_4_ = uVar114;
  auVar72._0_28_ =
       ZEXT1628(CONCAT412(auVar41._12_4_ * 0.055555556,
                          CONCAT48(auVar41._8_4_ * 0.055555556,
                                   CONCAT44(auVar41._4_4_ * 0.055555556,auVar41._0_4_ * 0.055555556)
                                  )));
  auVar65 = ZEXT1232(auVar18) << 0x20;
  auVar70 = vblendps_avx(auVar72,auVar65,1);
  auVar68 = vsubps_avx512vl(auVar79,auVar70);
  auVar70 = vblendps_avx(auVar72,auVar65,0x80);
  auVar72 = vaddps_avx512vl(auVar79,auVar70);
  auVar70 = vmaxps_avx512vl(auVar68,auVar72);
  auVar70 = vmaxps_avx(auVar64,auVar70);
  auVar64 = vshufps_avx(auVar70,auVar70,0xb1);
  auVar70 = vmaxps_avx(auVar70,auVar64);
  auVar64 = vshufpd_avx(auVar70,auVar70,5);
  auVar70 = vmaxps_avx(auVar70,auVar64);
  auVar41 = vmaxps_avx(auVar70._0_16_,auVar70._16_16_);
  auVar70 = vpermps_avx512vl(auVar69,ZEXT1632(auVar42));
  auVar64 = vpermps_avx512vl(auVar69,ZEXT1632(auVar46));
  auVar74 = vpermps_avx512vl(auVar69,ZEXT1632(auVar61));
  auVar69 = vpermps_avx512vl(auVar69,ZEXT1632(auVar60));
  auVar73 = vmulps_avx512vl(auVar69,auVar24);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar19,auVar74);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar81,auVar64);
  auVar80 = vfmadd231ps_avx512vl(auVar73,auVar20,auVar70);
  auVar73._4_4_ = fVar82 * auVar69._4_4_;
  auVar73._0_4_ = fVar85 * auVar69._0_4_;
  auVar73._8_4_ = fVar98 * auVar69._8_4_;
  auVar73._12_4_ = fVar84 * auVar69._12_4_;
  auVar73._16_4_ = fVar102 * auVar69._16_4_;
  auVar73._20_4_ = fVar110 * auVar69._20_4_;
  auVar73._24_4_ = fVar111 * auVar69._24_4_;
  auVar73._28_4_ = auVar69._28_4_;
  auVar58 = vfmadd231ps_fma(auVar73,auVar21,auVar74);
  auVar69 = vmaxps_avx512vl(auVar106,auVar80);
  auVar64 = vfmadd231ps_avx512vl(ZEXT1632(auVar58),auVar22,auVar64);
  auVar58 = vfmadd231ps_fma(auVar64,auVar23,auVar70);
  auVar74._28_4_ = auVar70._28_4_;
  auVar74._0_28_ =
       ZEXT1628(CONCAT412(auVar58._12_4_ * 0.055555556,
                          CONCAT48(auVar58._8_4_ * 0.055555556,
                                   CONCAT44(auVar58._4_4_ * 0.055555556,auVar58._0_4_ * 0.055555556)
                                  )));
  auVar70 = vblendps_avx(auVar74,auVar65,1);
  auVar73 = vsubps_avx512vl(auVar80,auVar70);
  auVar70 = vblendps_avx(auVar74,auVar65,0x80);
  auVar74 = vaddps_avx512vl(auVar80,auVar70);
  auVar70 = vmaxps_avx(auVar73,auVar74);
  auVar70 = vmaxps_avx(auVar69,auVar70);
  auVar64 = vshufps_avx(auVar70,auVar70,0xb1);
  auVar70 = vmaxps_avx(auVar70,auVar64);
  auVar64 = vshufpd_avx(auVar70,auVar70,5);
  auVar70 = vmaxps_avx(auVar70,auVar64);
  auVar58 = vmaxps_avx(auVar70._0_16_,auVar70._16_16_);
  auVar58 = vunpcklps_avx(auVar41,auVar58);
  auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar64 = vpermps_avx512vl(auVar70,ZEXT1632(auVar42));
  auVar69 = vpermps_avx512vl(auVar70,ZEXT1632(auVar46));
  auVar76 = vpermps_avx512vl(auVar70,ZEXT1632(auVar61));
  auVar70 = vpermps_avx512vl(auVar70,ZEXT1632(auVar60));
  auVar75 = vmulps_avx512vl(auVar70,auVar24);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar19,auVar76);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar81,auVar69);
  auVar81 = vfmadd231ps_avx512vl(auVar75,auVar20,auVar64);
  auVar75._4_4_ = auVar70._4_4_ * fVar82;
  auVar75._0_4_ = auVar70._0_4_ * fVar85;
  auVar75._8_4_ = auVar70._8_4_ * fVar98;
  auVar75._12_4_ = auVar70._12_4_ * fVar84;
  auVar75._16_4_ = auVar70._16_4_ * fVar102;
  auVar75._20_4_ = auVar70._20_4_ * fVar110;
  auVar75._24_4_ = auVar70._24_4_ * fVar111;
  auVar75._28_4_ = auVar70._28_4_;
  auVar41 = vfmadd231ps_fma(auVar75,auVar21,auVar76);
  auVar75 = vmaxps_avx512vl(auVar106,auVar81);
  auVar70 = vfmadd231ps_avx512vl(ZEXT1632(auVar41),auVar22,auVar69);
  auVar41 = vfmadd231ps_fma(auVar70,auVar23,auVar64);
  auVar76._28_4_ = auVar64._28_4_;
  auVar76._0_28_ =
       ZEXT1628(CONCAT412(auVar41._12_4_ * 0.055555556,
                          CONCAT48(auVar41._8_4_ * 0.055555556,
                                   CONCAT44(auVar41._4_4_ * 0.055555556,auVar41._0_4_ * 0.055555556)
                                  )));
  auVar70 = vblendps_avx(auVar76,auVar65,1);
  auVar69 = vsubps_avx512vl(auVar81,auVar70);
  auVar70 = vblendps_avx(auVar76,auVar65,0x80);
  auVar76 = vaddps_avx512vl(auVar81,auVar70);
  auVar70 = vmaxps_avx(auVar69,auVar76);
  auVar70 = vmaxps_avx(auVar75,auVar70);
  auVar64 = vshufps_avx(auVar70,auVar70,0xb1);
  auVar70 = vmaxps_avx(auVar70,auVar64);
  auVar64 = vshufpd_avx(auVar70,auVar70,5);
  auVar70 = vmaxps_avx(auVar70,auVar64);
  auVar41 = vmaxps_avx(auVar70._0_16_,auVar70._16_16_);
  auVar41 = vinsertps_avx(auVar58,auVar41,0x28);
  auVar70 = vminps_avx512vl(auVar68,auVar72);
  auVar64 = vminps_avx512vl(auVar66,auVar79);
  auVar70 = vminps_avx(auVar64,auVar70);
  auVar64 = vshufps_avx(auVar70,auVar70,0xb1);
  auVar70 = vminps_avx(auVar70,auVar64);
  auVar64 = vshufpd_avx(auVar70,auVar70,5);
  auVar70 = vminps_avx(auVar70,auVar64);
  auVar58 = vminps_avx(auVar70._0_16_,auVar70._16_16_);
  auVar104 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
  auVar70 = vminps_avx(auVar73,auVar74);
  auVar64 = vminps_avx512vl(auVar66,auVar80);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
  auVar115 = ZEXT1664(auVar46);
  auVar70 = vminps_avx(auVar64,auVar70);
  auVar64 = vshufps_avx(auVar70,auVar70,0xb1);
  auVar70 = vminps_avx(auVar70,auVar64);
  auVar64 = vshufpd_avx(auVar70,auVar70,5);
  auVar70 = vminps_avx(auVar70,auVar64);
  auVar42 = vminps_avx(auVar70._0_16_,auVar70._16_16_);
  auVar42 = vunpcklps_avx(auVar58,auVar42);
  auVar70 = vminps_avx(auVar69,auVar76);
  auVar64 = vminps_avx512vl(auVar66,auVar81);
  auVar70 = vminps_avx(auVar64,auVar70);
  auVar64 = vshufps_avx(auVar70,auVar70,0xb1);
  auVar70 = vminps_avx(auVar70,auVar64);
  auVar64 = vshufpd_avx(auVar70,auVar70,5);
  auVar70 = vminps_avx(auVar70,auVar64);
  auVar58 = vminps_avx(auVar70._0_16_,auVar70._16_16_);
  auVar58 = vinsertps_avx(auVar42,auVar58,0x28);
  auVar70 = vshufps_avx512vl(auVar78,auVar78,0xb1);
  auVar64 = vminps_avx512vl(auVar78,auVar70);
  auVar70 = vshufpd_avx(auVar64,auVar64,5);
  auVar70 = vminps_avx(auVar64,auVar70);
  auVar42 = vminps_avx(auVar70._0_16_,auVar70._16_16_);
  auVar70 = vshufps_avx512vl(auVar71,auVar71,0xb1);
  auVar64 = vminps_avx512vl(auVar71,auVar70);
  auVar70 = vshufpd_avx(auVar64,auVar64,5);
  auVar70 = vminps_avx(auVar64,auVar70);
  auVar61 = vminps_avx(auVar70._0_16_,auVar70._16_16_);
  auVar61 = vunpcklps_avx(auVar42,auVar61);
  auVar70 = vshufps_avx512vl(auVar67,auVar67,0xb1);
  auVar64 = vminps_avx512vl(auVar67,auVar70);
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
  auVar116 = ZEXT1664(auVar54);
  auVar70 = vshufpd_avx(auVar64,auVar64,5);
  auVar70 = vminps_avx(auVar64,auVar70);
  auVar42 = vminps_avx(auVar70._0_16_,auVar70._16_16_);
  auVar42 = vinsertps_avx(auVar61,auVar42,0x28);
  auVar61 = vminps_avx(auVar58,auVar42);
  auVar70 = vshufps_avx512vl(auVar77,auVar77,0xb1);
  auVar70 = vmaxps_avx512vl(auVar77,auVar70);
  auVar64 = vshufpd_avx(auVar70,auVar70,5);
  auVar64 = vmaxps_avx(auVar70,auVar64);
  auVar58 = vmaxps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar64 = vshufps_avx(_local_208,_local_208,0xb1);
  auVar64 = vmaxps_avx(_local_208,auVar64);
  auVar66 = vshufpd_avx(auVar64,auVar64,5);
  auVar64 = vmaxps_avx(auVar64,auVar66);
  auVar42 = vmaxps_avx(auVar64._0_16_,auVar64._16_16_);
  auVar42 = vunpcklps_avx(auVar58,auVar42);
  auVar64 = vshufps_avx(auVar63,auVar63,0xb1);
  auVar63 = vmaxps_avx(auVar63,auVar64);
  auVar64 = vshufpd_avx(auVar63,auVar63,5);
  auVar63 = vmaxps_avx(auVar63,auVar64);
  auVar58 = vmaxps_avx(auVar63._0_16_,auVar63._16_16_);
  auVar58 = vinsertps_avx(auVar42,auVar58,0x28);
  auVar41 = vmaxps_avx(auVar41,auVar58);
  uVar15 = vcmpps_avx512vl(auVar41,auVar54,1);
  uVar16 = vcmpps_avx512vl(auVar61,auVar46,6);
  lVar33 = lVar33 + 0x38;
  if ((~((ushort)uVar15 & (ushort)uVar16) & 7) != 0) goto LAB_01c22e2f;
  goto LAB_01c22381;
LAB_01c22e2f:
  auVar100 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_01c22e4f:
  uVar30 = uVar30 + 1;
  goto LAB_01c2221a;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }